

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O2

Abc_Obj_t * Abc_ObjInsertBetween(Abc_Obj_t *pNodeIn,Abc_Obj_t *pNodeOut,Abc_ObjType_t Type)

{
  int i;
  int i_00;
  Abc_Obj_t *pAVar1;
  char *pcVar2;
  char *__format;
  
  i = Vec_IntFind(&pNodeIn->vFanouts,pNodeOut->Id);
  if (i == -1) {
    pcVar2 = Abc_ObjName(pNodeOut);
    printf("Node %s is not among",pcVar2);
    pcVar2 = Abc_ObjName(pNodeIn);
    __format = " the fanouts of node %s...\n";
  }
  else {
    i_00 = Vec_IntFind(&pNodeOut->vFanins,pNodeIn->Id);
    if (i_00 != -1) {
      pAVar1 = Abc_NtkCreateObj(pNodeIn->pNtk,Type);
      Vec_IntPushMem(pAVar1->pNtk->pMmStep,&pAVar1->vFanins,pNodeIn->Id);
      Vec_IntPushMem(pAVar1->pNtk->pMmStep,&pAVar1->vFanouts,pNodeOut->Id);
      Vec_IntWriteEntry(&pNodeIn->vFanouts,i,pAVar1->Id);
      Vec_IntWriteEntry(&pNodeOut->vFanins,i_00,pAVar1->Id);
      return pAVar1;
    }
    pcVar2 = Abc_ObjName(pNodeIn);
    printf("Node %s is not among",pcVar2);
    pcVar2 = Abc_ObjName(pNodeOut);
    __format = " the fanins of node %s...\n";
  }
  printf(__format,pcVar2);
  return (Abc_Obj_t *)0x0;
}

Assistant:

Abc_Obj_t * Abc_ObjInsertBetween( Abc_Obj_t * pNodeIn, Abc_Obj_t * pNodeOut, Abc_ObjType_t Type )
{
    Abc_Obj_t * pNodeNew;
    int iFanoutIndex, iFaninIndex;
    // find pNodeOut among the fanouts of pNodeIn
    if ( (iFanoutIndex = Vec_IntFind( &pNodeIn->vFanouts, pNodeOut->Id )) == -1 )
    {
        printf( "Node %s is not among", Abc_ObjName(pNodeOut) );
        printf( " the fanouts of node %s...\n", Abc_ObjName(pNodeIn) );
        return NULL;
    }
    // find pNodeIn among the fanins of pNodeOut
    if ( (iFaninIndex = Vec_IntFind( &pNodeOut->vFanins, pNodeIn->Id )) == -1 )
    {
        printf( "Node %s is not among", Abc_ObjName(pNodeIn) );
        printf( " the fanins of node %s...\n", Abc_ObjName(pNodeOut) );
        return NULL;
    }
    // create the new node
    pNodeNew = Abc_NtkCreateObj( pNodeIn->pNtk, Type );
    // add pNodeIn as fanin and pNodeOut as fanout
    Vec_IntPushMem( pNodeNew->pNtk->pMmStep, &pNodeNew->vFanins,  pNodeIn->Id  );
    Vec_IntPushMem( pNodeNew->pNtk->pMmStep, &pNodeNew->vFanouts, pNodeOut->Id );
    // update the fanout of pNodeIn
    Vec_IntWriteEntry( &pNodeIn->vFanouts, iFanoutIndex, pNodeNew->Id );
    // update the fanin of pNodeOut
    Vec_IntWriteEntry( &pNodeOut->vFanins, iFaninIndex, pNodeNew->Id );
    return pNodeNew;
}